

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::FunctionMocker<void_(ot::commissioner::Error)>::PerformDefaultAction
          (FunctionMocker<void_(ot::commissioner::Error)> *this,ArgumentTuple *args,
          string *call_description)

{
  bool bVar1;
  Action<void_(ot::commissioner::Error)> *this_00;
  runtime_error *this_01;
  undefined1 local_80 [8];
  string message;
  tuple<ot::commissioner::Error> local_50;
  OnCallSpec<void_(ot::commissioner::Error)> *local_28;
  OnCallSpec<void_(ot::commissioner::Error)> *spec;
  string *call_description_local;
  ArgumentTuple *args_local;
  FunctionMocker<void_(ot::commissioner::Error)> *this_local;
  
  spec = (OnCallSpec<void_(ot::commissioner::Error)> *)call_description;
  call_description_local = (string *)args;
  args_local = (ArgumentTuple *)this;
  local_28 = FindOnCallSpec(this,args);
  if (local_28 == (OnCallSpec<void_(ot::commissioner::Error)> *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)spec,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    bVar1 = DefaultValue<void>::Exists();
    if (!bVar1) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,(string *)local_80);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    DefaultValue<void>::Get();
    std::__cxx11::string::~string((string *)local_80);
  }
  else {
    this_00 = OnCallSpec<void_(ot::commissioner::Error)>::GetAction(local_28);
    std::tuple<ot::commissioner::Error>::tuple
              (&local_50,(tuple<ot::commissioner::Error> *)call_description_local);
    Action<void_(ot::commissioner::Error)>::Perform(this_00,&local_50);
    std::tuple<ot::commissioner::Error>::~tuple(&local_50);
  }
  return;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }